

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O3

Expression * __thiscall
wasm::OptimizeInstructions::optimizeMemoryCopy(OptimizeInstructions *this,MemoryCopy *memCopy)

{
  PassRunner *pPVar1;
  Expression *pEVar2;
  Name memory;
  bool bVar3;
  Drop *pDVar4;
  Block *pBVar5;
  int64_t iVar6;
  Expression *value;
  Store *pSVar7;
  uint bytes;
  initializer_list<wasm::Expression_*> *items;
  Expression *pEVar8;
  MixedArena *pMVar9;
  Type type;
  size_t sVar10;
  char *pcVar11;
  undefined1 local_68 [16];
  Drop local_58;
  Builder local_38;
  Builder builder;
  
  pPVar1 = (this->
           super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
           ).super_Pass.runner;
  if ((((pPVar1->options).ignoreImplicitTraps != false) ||
      ((pPVar1->options).trapsNeverHappen == true)) &&
     (bVar3 = areConsecutiveInputsEqualAndFoldable(this,memCopy->dest,memCopy->source), bVar3)) {
    local_38.wasm =
         (this->
         super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
         ).
         super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
         .currModule;
    pEVar8 = memCopy->dest;
    pMVar9 = &(local_38.wasm)->allocator;
    pDVar4 = (Drop *)MixedArena::allocSpace(pMVar9,0x18,8);
    (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar4->value = pEVar8;
    Drop::finalize(pDVar4);
    pEVar8 = memCopy->source;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ = pDVar4;
    pDVar4 = (Drop *)MixedArena::allocSpace(pMVar9,0x18,8);
    (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar4->value = pEVar8;
    Drop::finalize(pDVar4);
    pEVar8 = memCopy->size;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)pDVar4;
    pDVar4 = (Drop *)MixedArena::allocSpace(pMVar9,0x18,8);
    (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
    (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
    pDVar4->value = pEVar8;
    Drop::finalize(pDVar4);
    items = (initializer_list<wasm::Expression_*> *)local_68;
    local_68._8_8_ = (Drop *)0x3;
    local_68._0_8_ = &local_58;
    local_58.value = (Expression *)pDVar4;
LAB_007f44dd:
    pBVar5 = Builder::makeBlock<std::initializer_list<wasm::Expression_*>,_true>(&local_38,items);
    return (Expression *)pBVar5;
  }
  if (memCopy->size->_id != ConstId) {
    return (Expression *)0x0;
  }
  iVar6 = Literal::getInteger((Literal *)(memCopy->size + 1));
  local_38.wasm =
       (this->
       super_WalkerPass<wasm::PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>_>
       ).
       super_PostWalker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>
       .super_Walker<wasm::OptimizeInstructions,_wasm::Visitor<wasm::OptimizeInstructions,_void>_>.
       currModule;
  switch(iVar6) {
  case 0:
    if (((pPVar1->options).ignoreImplicitTraps != false) ||
       ((pPVar1->options).trapsNeverHappen == true)) {
      pEVar8 = memCopy->dest;
      pMVar9 = &(local_38.wasm)->allocator;
      pDVar4 = (Drop *)MixedArena::allocSpace(pMVar9,0x18,8);
      (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar4->value = pEVar8;
      Drop::finalize(pDVar4);
      pEVar8 = memCopy->source;
      local_68._0_8_ = pDVar4;
      pDVar4 = (Drop *)MixedArena::allocSpace(pMVar9,0x18,8);
      (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression._id = DropId;
      (pDVar4->super_SpecificExpression<(wasm::Expression::Id)18>).super_Expression.type.id = 0;
      pDVar4->value = pEVar8;
      Drop::finalize(pDVar4);
      items = (initializer_list<wasm::Expression_*> *)&local_58;
      local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id = 2;
      local_68._8_8_ = pDVar4;
      local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
           (Drop *)local_68;
      goto LAB_007f44dd;
    }
    break;
  case 1:
  case 2:
  case 4:
    pEVar8 = memCopy->dest;
    pEVar2 = memCopy->source;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (memCopy->sourceMemory).super_IString.str._M_len;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)(memCopy->sourceMemory).super_IString.str._M_str;
    value = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
    value->_id = LoadId;
    *(undefined1 *)&value[2].type.id = 0;
    *(char *)&value[1]._id = (char)iVar6;
    *(byte *)((long)&value[1]._id + 1) = 0;
    value[1].type.id = 0;
    *(undefined8 *)(value + 2) = 1;
    *(Expression **)(value + 3) = pEVar2;
    (value->type).id = 2;
    value[3].type.id =
         local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
    *(uintptr_t *)(value + 4) =
         local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id;
    sVar10 = (memCopy->destMemory).super_IString.str._M_len;
    pcVar11 = (memCopy->destMemory).super_IString.str._M_str;
    type.id = 2;
    bytes = (uint)iVar6;
    goto LAB_007f46c4;
  case 3:
  case 5:
  case 6:
  case 7:
    break;
  case 8:
    pEVar8 = memCopy->dest;
    pEVar2 = memCopy->source;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
         (memCopy->sourceMemory).super_IString.str._M_len;
    local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
         (uintptr_t)(memCopy->sourceMemory).super_IString.str._M_str;
    value = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
    value->_id = LoadId;
    *(undefined1 *)&value[2].type.id = 0;
    *(undefined2 *)&value[1]._id = LocalGetId;
    value[1].type.id = 0;
    *(undefined8 *)(value + 2) = 1;
    *(Expression **)(value + 3) = pEVar2;
    (value->type).id = 3;
    value[3].type.id =
         local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
    *(uintptr_t *)(value + 4) =
         local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id;
    sVar10 = (memCopy->destMemory).super_IString.str._M_len;
    pcVar11 = (memCopy->destMemory).super_IString.str._M_str;
    type.id = 3;
    bytes = 8;
LAB_007f46c4:
    memory.super_IString.str._M_str = pcVar11;
    memory.super_IString.str._M_len = sVar10;
    pSVar7 = Builder::makeStore(&local_38,bytes,(Address)0x0,1,pEVar8,value,type,memory);
    return (Expression *)pSVar7;
  default:
    if (((iVar6 == 0x10) && ((pPVar1->options).shrinkLevel == 0)) &&
       ((((local_38.wasm)->features).features & 8) != 0)) {
      pEVar8 = memCopy->dest;
      pEVar2 = memCopy->source;
      local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_ =
           (memCopy->sourceMemory).super_IString.str._M_len;
      local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id =
           (uintptr_t)(memCopy->sourceMemory).super_IString.str._M_str;
      value = (Expression *)MixedArena::allocSpace(&(local_38.wasm)->allocator,0x48,8);
      value->_id = LoadId;
      *(undefined1 *)&value[2].type.id = 0;
      *(undefined2 *)&value[1]._id = BinaryId;
      value[1].type.id = 0;
      *(undefined8 *)(value + 2) = 1;
      *(Expression **)(value + 3) = pEVar2;
      (value->type).id = 6;
      value[3].type.id =
           local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression._0_8_;
      *(uintptr_t *)(value + 4) =
           local_58.super_SpecificExpression<(wasm::Expression::Id)18>.super_Expression.type.id;
      sVar10 = (memCopy->destMemory).super_IString.str._M_len;
      pcVar11 = (memCopy->destMemory).super_IString.str._M_str;
      type.id = 6;
      bytes = 0x10;
      goto LAB_007f46c4;
    }
  }
  return (Expression *)0x0;
}

Assistant:

Expression* optimizeMemoryCopy(MemoryCopy* memCopy) {
    auto& options = getPassOptions();

    if (options.ignoreImplicitTraps || options.trapsNeverHappen) {
      if (areConsecutiveInputsEqual(memCopy->dest, memCopy->source)) {
        // memory.copy(x, x, sz)  ==>  {drop(x), drop(x), drop(sz)}
        Builder builder(*getModule());
        return builder.makeBlock({builder.makeDrop(memCopy->dest),
                                  builder.makeDrop(memCopy->source),
                                  builder.makeDrop(memCopy->size)});
      }
    }

    // memory.copy(dst, src, C)  ==>  store(dst, load(src))
    if (auto* csize = memCopy->size->dynCast<Const>()) {
      auto bytes = csize->value.getInteger();
      Builder builder(*getModule());

      switch (bytes) {
        case 0: {
          if (options.ignoreImplicitTraps || options.trapsNeverHappen) {
            // memory.copy(dst, src, 0)  ==>  {drop(dst), drop(src)}
            return builder.makeBlock({builder.makeDrop(memCopy->dest),
                                      builder.makeDrop(memCopy->source)});
          }
          break;
        }
        case 1:
        case 2:
        case 4: {
          return builder.makeStore(bytes, // bytes
                                   0,     // offset
                                   1,     // align
                                   memCopy->dest,
                                   builder.makeLoad(bytes,
                                                    false,
                                                    0,
                                                    1,
                                                    memCopy->source,
                                                    Type::i32,
                                                    memCopy->sourceMemory),
                                   Type::i32,
                                   memCopy->destMemory);
        }
        case 8: {
          return builder.makeStore(bytes, // bytes
                                   0,     // offset
                                   1,     // align
                                   memCopy->dest,
                                   builder.makeLoad(bytes,
                                                    false,
                                                    0,
                                                    1,
                                                    memCopy->source,
                                                    Type::i64,
                                                    memCopy->sourceMemory),
                                   Type::i64,
                                   memCopy->destMemory);
        }
        case 16: {
          if (options.shrinkLevel == 0) {
            // This adds an extra 2 bytes so apply it only for
            // minimal shrink level
            if (getModule()->features.hasSIMD()) {
              return builder.makeStore(bytes, // bytes
                                       0,     // offset
                                       1,     // align
                                       memCopy->dest,
                                       builder.makeLoad(bytes,
                                                        false,
                                                        0,
                                                        1,
                                                        memCopy->source,
                                                        Type::v128,
                                                        memCopy->sourceMemory),
                                       Type::v128,
                                       memCopy->destMemory);
            }
          }
          break;
        }
        default: {
        }
      }
    }
    return nullptr;
  }